

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O2

Array2D<unsigned_int> * __thiscall
WFC::wave_to_output(Array2D<unsigned_int> *__return_storage_ptr__,WFC *this)

{
  ulong uVar1;
  size_t sVar2;
  pointer puVar3;
  pointer puVar4;
  uint i;
  ulong uVar5;
  ulong uVar6;
  
  Array2D<unsigned_int>::Array2D
            (__return_storage_ptr__,(ulong)(this->wave).height,(ulong)(this->wave).width);
  uVar1 = this->nb_patterns;
  for (uVar5 = 0; uVar5 < (this->wave).size; uVar5 = uVar5 + 1) {
    sVar2 = (this->wave).data.width;
    puVar3 = (this->wave).data.data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (__return_storage_ptr__->data).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar6 = 0; uVar6 < uVar1; uVar6 = (ulong)((uint)uVar6 + 1)) {
      if (puVar3[uVar6 + sVar2 * uVar5] != '\0') {
        puVar4[uVar5] = (uint)uVar6;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<unsigned> WFC::wave_to_output() const noexcept {
  Array2D<unsigned> output_patterns(wave.height, wave.width);
  for (unsigned i = 0; i < wave.size; i++) {
    for (unsigned k = 0; k < nb_patterns; k++) {
      if (wave.get(i, k)) {
        output_patterns.data[i] = k;
      }
    }
  }
  return output_patterns;
}